

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void isPositive(char *attrName,float f)

{
  ostream *poVar1;
  invalid_argument *this;
  char *in_RDI;
  float in_XMM0_Da;
  stringstream e;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [384];
  char *local_8;
  
  if (in_XMM0_Da <= 0.0) {
    local_8 = in_RDI;
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"The value for the ");
    poVar1 = std::operator<<(poVar1,local_8);
    std::operator<<(poVar1," attribute must be greater than zero");
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::invalid_argument::invalid_argument(this,local_1c8);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void
isPositive (const char attrName[], float f)
{
    if (f <= 0)
    {
        std::stringstream e;
        e << "The value for the " << attrName
          << " attribute must be greater than zero";
        throw invalid_argument(e.str());
    }
}